

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryFileFormat.cpp
# Opt level: O2

int __thiscall pbrt::Sampler::writeTo(Sampler *this,BinaryWriter *binary)

{
  int samplerType;
  
  BinaryWriter::write<int>(binary,&samplerType);
  BinaryWriter::write<int>(binary,&this->pixelSamples);
  BinaryWriter::write<int>(binary,&this->xSamples);
  BinaryWriter::write<int>(binary,&this->ySamples);
  return 8;
}

Assistant:

int Sampler::writeTo(BinaryWriter &binary) {
      int samplerType = static_cast<int>(type);
      binary.write(samplerType);
      binary.write(pixelSamples);
      binary.write(xSamples);
      binary.write(ySamples);
      return TYPE_SAMPLER;
  }